

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesSchedulerSetComputeUnitDebugMode
          (zes_sched_handle_t hScheduler,ze_bool_t *pNeedReload)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zesSchedulerSetComputeUnitDebugMode(hScheduler, pNeedReload)",
             &local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0xa80) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0xa80);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesSchedulerSetComputeUnitDebugModePrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(lVar2 + 0xd48) + 8),
                                hScheduler,pNeedReload), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hScheduler,pNeedReload);
          lVar4 = 0;
          goto LAB_00171c31;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x770))(plVar1,hScheduler,pNeedReload);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00171c5f;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x778))(plVar1,hScheduler,pNeedReload,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00171c31:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_00171c5f:
  logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerSetComputeUnitDebugMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        context.logger->log_trace("zesSchedulerSetComputeUnitDebugMode(hScheduler, pNeedReload)");

        auto pfnSetComputeUnitDebugMode = context.zesDdiTable.Scheduler.pfnSetComputeUnitDebugMode;

        if( nullptr == pfnSetComputeUnitDebugMode )
            return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesSchedulerSetComputeUnitDebugModePrologue( hScheduler, pNeedReload );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesSchedulerSetComputeUnitDebugModePrologue( hScheduler, pNeedReload );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }

        auto driver_result = pfnSetComputeUnitDebugMode( hScheduler, pNeedReload );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesSchedulerSetComputeUnitDebugModeEpilogue( hScheduler, pNeedReload ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }

        return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", driver_result);
    }